

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

bool __thiscall vkt::memory::anon_unknown_0::MemoryTestInstance::prepare(MemoryTestInstance *this)

{
  size_type *psVar1;
  MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  *this_00;
  TestLog *log;
  Memory *pMVar2;
  long *plVar3;
  undefined8 *puVar4;
  PrepareContext *pPVar5;
  pointer ppCVar6;
  long *plVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong uVar10;
  bool bVar11;
  ScopedLogSection section;
  string local_2f8;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  undefined8 uStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  ulong *local_298;
  long local_290;
  ulong local_288 [2];
  string local_278;
  long *local_258 [2];
  long local_248 [2];
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  ScopedLogSection local_218;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  ResultCollector *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  local_1a8 [7];
  ios_base local_138 [264];
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_258,0,(char *)0x0,0xb5685e);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_2a8 = *plVar7;
    lStack_2a0 = plVar3[3];
    local_2b8 = &local_2a8;
  }
  else {
    local_2a8 = *plVar7;
    local_2b8 = (long *)*plVar3;
  }
  local_2b0 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
  puVar9 = &local_2c8;
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_2c8 = *puVar8;
    uStack_2c0 = puVar4[3];
    local_2d8 = puVar9;
  }
  else {
    local_2c8 = *puVar8;
    local_2d8 = (ulong *)*puVar4;
  }
  local_2d0 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar10 = 0xf;
  if (local_2d8 != puVar9) {
    uVar10 = local_2c8;
  }
  if (uVar10 < (ulong)(local_290 + local_2d0)) {
    uVar10 = 0xf;
    if (local_298 != local_288) {
      uVar10 = local_288[0];
    }
    if (uVar10 < (ulong)(local_290 + local_2d0)) goto LAB_0068838b;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
  }
  else {
LAB_0068838b:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_298);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2f8.field_2._M_allocated_capacity = *psVar1;
    local_2f8.field_2._8_8_ = puVar4[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar1;
    local_2f8._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_2f8._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0xb59e07);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_1d8 = *plVar7;
    lStack_1d0 = plVar3[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *plVar7;
    local_1e8 = (long *)*plVar3;
  }
  local_1e0 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_228 = *puVar8;
    lStack_220 = plVar3[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar8;
    local_238 = (ulong *)*plVar3;
  }
  local_230 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar10 = 0xf;
  if (local_238 != &local_228) {
    uVar10 = local_228;
  }
  if (uVar10 < (ulong)(local_208 + local_230)) {
    uVar10 = 0xf;
    if (local_210 != local_200) {
      uVar10 = local_200[0];
    }
    if ((ulong)(local_208 + local_230) <= uVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_238);
      goto LAB_006885ed;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_210);
LAB_006885ed:
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_278.field_2._M_allocated_capacity = *psVar1;
    local_278.field_2._8_8_ = puVar4[3];
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar1;
    local_278._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_278._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_218,log,&local_2f8,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  if (local_2d8 != puVar9) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  pPVar5 = (PrepareContext *)operator_new(0x70);
  pMVar2 = (this->m_memory).
           super_UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
           .m_data.ptr;
  pPVar5->m_context =
       (this->m_renderContext).
       super_UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
       .m_data.ptr;
  pPVar5->m_memory = pMVar2;
  (pPVar5->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       0;
  (pPVar5->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (pPVar5->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pPVar5->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (pPVar5->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       0;
  (pPVar5->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (pPVar5->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pPVar5->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  local_1a8[0].m_data.ptr = (PrepareContext *)0x0;
  this_00 = &this->m_prepareContext;
  if ((this->m_prepareContext).
      super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
      .m_data.ptr != pPVar5) {
    de::details::
    UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
    ::reset(&this_00->
             super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
           );
    (this_00->
    super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
    ).m_data.ptr = pPVar5;
  }
  de::details::
  UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::reset(local_1a8);
  local_278._M_dataplus._M_p = (pointer)0x0;
  ppCVar6 = (this->m_commands).
            super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar11 = (this->m_commands).
           super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
           ._M_impl.super__Vector_impl_data._M_finish != ppCVar6;
  if (bVar11) {
    local_1f0 = &this->m_resultCollector;
    do {
      (*ppCVar6[(long)local_278._M_dataplus._M_p]->_vptr_Command[5])
                (ppCVar6[(long)local_278._M_dataplus._M_p],
                 (this_00->
                 super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
                 ).m_data.ptr);
      local_278._M_dataplus._M_p = local_278._M_dataplus._M_p + 1;
      ppCVar6 = (this->m_commands).
                super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar11 = local_278._M_dataplus._M_p <
               (pointer)((long)(this->m_commands).
                               super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3);
    } while (bVar11);
  }
  if (!bVar11) {
    this->m_stage = (StageFunc)execute;
    *(undefined8 *)&this->field_0x258 = 0;
    puVar9 = (ulong *)&DAT_00000001;
  }
  tcu::TestLog::endSection(local_218.m_log);
  return (bool)((byte)puVar9 & 1);
}

Assistant:

bool MemoryTestInstance::prepare (void)
{
	TestLog&					log		= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection	section	(log, "MemoryType" + de::toString(m_memoryTypeNdx) + "Prepare" + de::toString(m_iteration),
											  "Memory type " + de::toString(m_memoryTypeNdx) + " prepare iteration" + de::toString(m_iteration));

	m_prepareContext = MovePtr<PrepareContext>(new PrepareContext(*m_renderContext, *m_memory));

	DE_ASSERT(!m_commands.empty());

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		Command& command = *m_commands[cmdNdx];

		try
		{
			command.prepare(*m_prepareContext);
		}
		catch (const tcu::TestError& e)
		{
			m_resultCollector.fail(de::toString(cmdNdx) + ":" + command.getName() + " failed to prepare, got exception: " + string(e.getMessage()));
			return nextMemoryType();
		}
	}

	m_stage = &MemoryTestInstance::execute;
	return true;
}